

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

Weight ON_Font::WeightFromWindowsLogfontWeight(int windows_logfont_weight)

{
  Weight font_weight;
  int iVar1;
  int iVar2;
  Weight WVar3;
  size_t i;
  ulong uVar4;
  int iVar5;
  
  WVar3 = Normal;
  if (((0xfffffc17 < windows_logfont_weight - 0x3e9U) &&
      (WVar3 = Thin, 0x95 < (uint)windows_logfont_weight)) &&
     (WVar3 = Heavy, (uint)windows_logfont_weight < 0x352)) {
    iVar1 = 400 - windows_logfont_weight;
    iVar5 = -iVar1;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    WVar3 = Normal;
    for (uVar4 = 0; (iVar5 != 0 && (uVar4 < 9)); uVar4 = uVar4 + 1) {
      font_weight = (&DAT_006a820c)[uVar4];
      iVar2 = WindowsLogfontWeightFromWeight(font_weight);
      iVar2 = iVar2 - windows_logfont_weight;
      iVar1 = -iVar2;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
      if (iVar1 < iVar5) {
        WVar3 = font_weight;
        iVar5 = iVar1;
      }
    }
  }
  return WVar3;
}

Assistant:

ON_Font::Weight ON_Font::WeightFromWindowsLogfontWeight(
  int windows_logfont_weight
  )
{
  if ( windows_logfont_weight <= 0 || windows_logfont_weight > 1000 )
    return ON_Font::Weight::Normal;

  if ( windows_logfont_weight < 150 )
    return ON_Font::Weight::Thin;

  if ( windows_logfont_weight >= 850 )
    return ON_Font::Weight::Heavy;

  const ON_Font::Weight weights[] = 
  {
    ON_Font::Weight::Thin, // = 1
    ON_Font::Weight::Ultralight, // = 2
    ON_Font::Weight::Light, // = 3
    ON_Font::Weight::Normal, // = 4
    ON_Font::Weight::Medium, // = 5
    ON_Font::Weight::Semibold, // = 6
    ON_Font::Weight::Bold, // = 7
    ON_Font::Weight::Ultrabold, // = 8
    ON_Font::Weight::Heavy, // = 9
  };

  const size_t weight_count = sizeof(weights) / sizeof(weights[0]);
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  int delta = std::abs(static_cast<int>(ON_Font::WindowsLogfontWeightFromWeight(font_weight)) - windows_logfont_weight);

  for (size_t i = 0; 0 != delta && i < weight_count; i++)
  {
    // look for a closer match
    int d = std::abs(static_cast<int>(ON_Font::WindowsLogfontWeightFromWeight(weights[i])) - windows_logfont_weight);
    if (d < delta)
    {
      font_weight = weights[i];
      delta = d;
    }
  }

  return font_weight;
}